

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O3

Vector2f __thiscall Rml::Element::GetContainingBlock(Element *this)

{
  Vector2f VVar1;
  ElementDocument *this_00;
  Context *this_01;
  Vector2i VVar2;
  Box *this_02;
  float fVar3;
  float fVar4;
  float local_28;
  float fStack_24;
  
  if (this->offset_parent == (Element *)0x0) {
    this_00 = GetOwnerDocument(this);
    local_28 = 0.0;
    fStack_24 = 0.0;
    if (this_00 != (ElementDocument *)0x0) {
      this_01 = ElementDocument::GetContext(this_00);
      local_28 = 0.0;
      fStack_24 = 0.0;
      if (this_01 != (Context *)0x0) {
        VVar2 = Context::GetDimensions(this_01);
        local_28 = (float)VVar2.x;
        fStack_24 = (float)VVar2.y;
      }
    }
  }
  else {
    this_02 = &this->offset_parent->main_box;
    if ((undefined1  [96])
        ((undefined1  [96])(this->meta->computed_values).common & (undefined1  [96])0x20) !=
        (undefined1  [96])0x0) {
      VVar1 = Box::GetSize(this_02,Padding);
      return VVar1;
    }
    VVar1 = Box::GetSize(this_02);
    fVar3 = ElementScroll::GetScrollbarSize(&this->meta->scroll,VERTICAL);
    fVar4 = ElementScroll::GetScrollbarSize(&this->meta->scroll,HORIZONTAL);
    local_28 = VVar1.x;
    fStack_24 = VVar1.y;
    local_28 = local_28 - fVar3;
    fStack_24 = fStack_24 - fVar4;
  }
  VVar1.y = fStack_24;
  VVar1.x = local_28;
  return VVar1;
}

Assistant:

Vector2f Element::GetContainingBlock()
{
	Vector2f containing_block;

	if (offset_parent)
	{
		using namespace Style;
		Position position_property = GetPosition();
		const Box& parent_box = offset_parent->GetBox();

		if (position_property == Position::Static || position_property == Position::Relative)
		{
			containing_block = parent_box.GetSize();
			containing_block.x -= meta->scroll.GetScrollbarSize(ElementScroll::VERTICAL);
			containing_block.y -= meta->scroll.GetScrollbarSize(ElementScroll::HORIZONTAL);
		}
		else if (position_property == Position::Absolute || position_property == Position::Fixed)
		{
			containing_block = parent_box.GetSize(BoxArea::Padding);
		}
	}
	else if (Context* context = GetContext())
	{
		containing_block = Vector2f(context->GetDimensions());
	}

	return containing_block;
}